

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_13e445::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable
          (OwnershipAnalysis *this)

{
  _Rb_tree_header *p_Var1;
  pointer *ppSVar2;
  pointer ppVar3;
  Command *pCVar4;
  pointer __s1;
  size_t sVar5;
  iterator __position;
  StringRef inputPath;
  iterator iVar6;
  int iVar7;
  Command *pCVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  BuildNode *pBVar11;
  ulong uVar12;
  pointer ppVar13;
  long lVar14;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *ppVar15;
  char *__s1_00;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_78;
  iterator iStack_70;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_68;
  BuildNode *local_58;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_50;
  pointer local_48;
  StringRef local_40;
  
  local_78 = (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0;
  iStack_70._M_current =
       (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0;
  local_68 = (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0;
  ppVar13 = (this->directoryInputNodesAndCommands).
            super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->directoryInputNodesAndCommands).
           super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar13 != ppVar3) {
    p_Var1 = &(this->excludedPaths)._M_t._M_impl.super__Rb_tree_header;
    do {
      pBVar11 = ppVar13->first;
      pCVar4 = ppVar13->second;
      inputPath.Data = (pBVar11->super_Node).name._M_dataplus._M_p;
      inputPath.Length = (pBVar11->super_Node).name._M_string_length;
      pCVar8 = includedOwnerOf(this,inputPath);
      if (pCVar8 == (Command *)0x0) {
        p_Var9 = (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          __s1 = (pBVar11->super_Node).name._M_dataplus._M_p;
          sVar5 = (pBVar11->super_Node).name._M_string_length;
          do {
            if ((*(size_t *)(*(long *)(p_Var9 + 1) + 0x10) == sVar5) &&
               ((sVar5 == 0 ||
                (iVar7 = bcmp(__s1,*(void **)(*(long *)(p_Var9 + 1) + 8),sVar5), iVar7 == 0))))
            break;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var1);
        }
        if ((((_Rb_tree_header *)p_Var9 == p_Var1) || (p_Var9[1]._M_parent == (_Base_ptr)0x0)) &&
           (pCVar4->repairViaOwnershipAnalysis == true)) {
          if (iStack_70._M_current == local_68) {
            std::
            vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
            ::
            _M_realloc_insert<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>const&>
                      ((vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
                        *)&local_78,iStack_70,ppVar13);
          }
          else {
            pCVar4 = ppVar13->second;
            (iStack_70._M_current)->first = ppVar13->first;
            (iStack_70._M_current)->second = pCVar4;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
      }
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != ppVar3);
  }
  ppVar13 = (this->outputNodesAndCommands).
            super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->outputNodesAndCommands).
             super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar13 != local_48) {
    do {
      iVar6._M_current = iStack_70._M_current;
      pBVar11 = ppVar13->first;
      pCVar4 = ppVar13->second;
      uVar10 = (long)iStack_70._M_current - (long)local_78;
      ppVar15 = local_78;
      if (0 < (long)uVar10 >> 6) {
        __s1_00 = (pBVar11->super_Node).name._M_dataplus._M_p;
        uVar12 = (pBVar11->super_Node).name._M_string_length;
        local_50 = (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)
                   ((long)&local_78->first + (uVar10 & 0xffffffffffffffc0));
        lVar14 = ((long)uVar10 >> 6) + 1;
        ppVar15 = local_78 + 2;
        local_58 = pBVar11;
        do {
          pBVar11 = ppVar15[-2].first;
          sVar5 = (pBVar11->super_Node).name._M_string_length;
          if (((sVar5 <= uVar12) &&
              ((sVar5 == 0 ||
               (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,sVar5), iVar7 == 0)
               ))) && (pCVar4->repairViaOwnershipAnalysis != false)) {
            ppVar15 = ppVar15 + -2;
            goto LAB_001375b1;
          }
          pBVar11 = ppVar15[-1].first;
          sVar5 = (pBVar11->super_Node).name._M_string_length;
          if (((sVar5 <= uVar12) &&
              ((sVar5 == 0 ||
               (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,sVar5), iVar7 == 0)
               ))) && (pCVar4->repairViaOwnershipAnalysis != false)) {
            ppVar15 = ppVar15 + -1;
            goto LAB_001375b1;
          }
          pBVar11 = ppVar15->first;
          sVar5 = (pBVar11->super_Node).name._M_string_length;
          if ((sVar5 <= uVar12) &&
             (((sVar5 == 0 ||
               (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,sVar5), iVar7 == 0)
               ) && (pCVar4->repairViaOwnershipAnalysis != false)))) goto LAB_001375b1;
          pBVar11 = ppVar15[1].first;
          sVar5 = (pBVar11->super_Node).name._M_string_length;
          if ((sVar5 <= uVar12) &&
             (((sVar5 == 0 ||
               (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,sVar5), iVar7 == 0)
               ) && (pCVar4->repairViaOwnershipAnalysis != false)))) {
            ppVar15 = ppVar15 + 1;
            goto LAB_001375b1;
          }
          lVar14 = lVar14 + -1;
          ppVar15 = ppVar15 + 4;
        } while (1 < lVar14);
        uVar10 = (long)iVar6._M_current - (long)local_50;
        pBVar11 = local_58;
        ppVar15 = local_50;
      }
      lVar14 = (long)uVar10 >> 4;
      if (lVar14 == 3) {
        __s1_00 = (pBVar11->super_Node).name._M_dataplus._M_p;
        uVar12 = (pBVar11->super_Node).name._M_string_length;
        pBVar11 = ppVar15->first;
        sVar5 = (pBVar11->super_Node).name._M_string_length;
        if (((uVar12 < sVar5) ||
            ((sVar5 != 0 &&
             (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,sVar5), iVar7 != 0)))
            ) || (pCVar4->repairViaOwnershipAnalysis == false)) {
          ppVar15 = ppVar15 + 1;
          goto LAB_00137547;
        }
LAB_001375b1:
        if (ppVar15 != iVar6._M_current) {
          __position._M_current =
               (pBVar11->mustScanAfterPaths).
               super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_40.Data = __s1_00;
          local_40.Length = uVar12;
          if (__position._M_current ==
              (pBVar11->mustScanAfterPaths).
              super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
            _M_realloc_insert<llvm::StringRef>(&pBVar11->mustScanAfterPaths,__position,&local_40);
          }
          else {
            (__position._M_current)->Data = __s1_00;
            (__position._M_current)->Length = uVar12;
            ppSVar2 = &(pBVar11->mustScanAfterPaths).
                       super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
                       .super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
        }
      }
      else {
        if (lVar14 == 2) {
          __s1_00 = (pBVar11->super_Node).name._M_dataplus._M_p;
          uVar12 = (pBVar11->super_Node).name._M_string_length;
LAB_00137547:
          pBVar11 = ppVar15->first;
          uVar10 = (pBVar11->super_Node).name._M_string_length;
          if ((uVar12 < uVar10) ||
             (((uVar10 != 0 &&
               (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,uVar10), iVar7 != 0
               )) || (pCVar4->repairViaOwnershipAnalysis == false)))) {
            ppVar15 = ppVar15 + 1;
            goto LAB_00137573;
          }
          goto LAB_001375b1;
        }
        if (lVar14 == 1) {
          __s1_00 = (pBVar11->super_Node).name._M_dataplus._M_p;
          uVar12 = (pBVar11->super_Node).name._M_string_length;
LAB_00137573:
          pBVar11 = ppVar15->first;
          uVar10 = (pBVar11->super_Node).name._M_string_length;
          if (((uVar10 <= uVar12) &&
              ((uVar10 == 0 ||
               (iVar7 = bcmp(__s1_00,(pBVar11->super_Node).name._M_dataplus._M_p,uVar10), iVar7 == 0
               )))) && (pCVar4->repairViaOwnershipAnalysis != false)) goto LAB_001375b1;
        }
      }
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != local_48);
  }
  if (local_78 != (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void deferScanningUnownedInputsUntilSubpathsAvailable() {
    auto unownedDirectoryInputNodesAndConsumingCommands = std::vector<std::pair<BuildNode*, Command*>>();
    std::copy_if(directoryInputNodesAndCommands.begin(),
                 directoryInputNodesAndCommands.end(),
                 std::back_inserter(unownedDirectoryInputNodesAndConsumingCommands),
                 [this](const std::pair<BuildNode*, Command*> directoryInputNodeAndCommand) -> bool {
      return isIncludedUnownedNode(directoryInputNodeAndCommand.first) && directoryInputNodeAndCommand.second->repairViaOwnershipAnalysis;
    });

    // For each output node and its producing command (e.g. "unowned-directory/a.txt" and "TaskA"),
    // check if there exists an unowned node (e.g. "unowned-directory/" used by "TaskC") that is a parent of the produced node.
    // Only add "a.txt" to mustScanAfterPaths of "unowned-directory/" if TaskC is marked as "repairViaOwnershipAnalysis".
    for (auto outputNodeAndCommand: outputNodesAndCommands) {
      auto repairableUnownedNode =
        std::find_if(unownedDirectoryInputNodesAndConsumingCommands.begin(),
                     unownedDirectoryInputNodesAndConsumingCommands.end(),
                     [=](std::pair<BuildNode*, Command*> unownedDirectoryAndCommand) -> bool {
          return outputNodeAndCommand.first->getName().startswith(unownedDirectoryAndCommand.first->getName()) && outputNodeAndCommand.second->repairViaOwnershipAnalysis == true;
      });
      
      if (repairableUnownedNode != unownedDirectoryInputNodesAndConsumingCommands.end()) {
        (*repairableUnownedNode).first->mustScanAfterPaths.push_back(outputNodeAndCommand.first->getName());
      }
    }
  }